

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O1

bool __thiscall
flow::Runtime::verifyNativeCalls(Runtime *this,IRProgram *program,IRBuilder *builder)

{
  IRHandler *pIVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  IRBuilder *pIVar4;
  long **pplVar5;
  long **pplVar6;
  char cVar7;
  pointer puVar8;
  long lVar9;
  Signature *pSVar10;
  NativeCallback *pNVar11;
  _List_node_base *p_Var12;
  long *plVar13;
  long *plVar14;
  bool bVar15;
  list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  calls;
  long *local_78;
  undefined1 *local_70;
  long local_68;
  IRBuilder *local_60;
  pointer local_58;
  pointer local_50;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *local_48;
  IRBuilder *local_40;
  long local_38;
  
  local_70 = (undefined1 *)&local_78;
  local_78 = (long *)&local_78;
  local_68 = 0;
  puVar8 = (program->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (program->handlers_).
             super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pplVar5 = &local_78;
  pplVar6 = &local_78;
  local_60 = builder;
  if (puVar8 != local_58) {
    do {
      local_70 = (undefined1 *)pplVar6;
      local_78 = (long *)pplVar5;
      pIVar1 = (puVar8->_M_t).
               super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
               super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
               super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
      plVar14 = *(long **)&(pIVar1->blocks_).
                           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                           ._M_impl;
      local_48 = &pIVar1->blocks_;
      local_50 = puVar8;
      if ((list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           *)plVar14 != local_48) {
        do {
          plVar2 = *(long **)(plVar14[2] + 0x58);
          for (plVar13 = *(long **)(plVar14[2] + 0x50); plVar13 != plVar2; plVar13 = plVar13 + 1) {
            p_Var3 = (_List_node_base *)*plVar13;
            if (p_Var3 == (_List_node_base *)0x0) {
              lVar9 = 0;
            }
            else {
              lVar9 = __dynamic_cast(p_Var3,&Instr::typeinfo,&CallInstr::typeinfo,0);
            }
            if (lVar9 == 0) {
              if (p_Var3 == (_List_node_base *)0x0) {
                lVar9 = 0;
              }
              else {
                lVar9 = __dynamic_cast(p_Var3,&Instr::typeinfo,&HandlerCallInstr::typeinfo,0);
              }
              if (lVar9 != 0) {
                pSVar10 = NativeCallback::signature
                                    (*(NativeCallback **)(**(long **)(lVar9 + 0x50) + 0x48));
                pNVar11 = find(this,pSVar10);
                if (pNVar11 != (NativeCallback *)0x0) {
                  p_Var12 = (_List_node_base *)operator_new(0x20);
                  goto LAB_00164ee1;
                }
              }
            }
            else {
              pSVar10 = NativeCallback::signature
                                  (*(NativeCallback **)(**(long **)(lVar9 + 0x50) + 0x48));
              pNVar11 = find(this,pSVar10);
              if (pNVar11 != (NativeCallback *)0x0) {
                p_Var12 = (_List_node_base *)operator_new(0x20);
LAB_00164ee1:
                p_Var12[1]._M_next = p_Var3;
                p_Var12[1]._M_prev = (_List_node_base *)pNVar11;
                std::__detail::_List_node_base::_M_hook(p_Var12);
                local_68 = local_68 + 1;
              }
            }
          }
          plVar14 = (long *)*plVar14;
        } while ((list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  *)plVar14 != local_48);
      }
      puVar8 = local_50 + 1;
      pplVar5 = (long **)local_78;
      pplVar6 = (long **)local_70;
    } while (puVar8 != local_58);
  }
  pIVar4 = local_60;
  bVar15 = (long **)local_78 == &local_78;
  if (!bVar15) {
    plVar14 = local_78;
    do {
      lVar9 = plVar14[3];
      if (*(long *)(lVar9 + 0x20) != 0) {
        local_38 = plVar14[2];
        local_40 = pIVar4;
        cVar7 = (**(code **)(lVar9 + 0x28))(lVar9 + 0x10,&local_38,&local_40);
        if (cVar7 == '\0') break;
      }
      plVar14 = (long *)*plVar14;
      bVar15 = (long **)plVar14 == &local_78;
    } while (!bVar15);
  }
  plVar14 = local_78;
  if ((long **)local_78 != &local_78) {
    do {
      plVar13 = (long *)*plVar14;
      operator_delete(plVar14,0x20);
      plVar14 = plVar13;
    } while ((long **)plVar13 != &local_78);
  }
  return bVar15;
}

Assistant:

bool Runtime::verifyNativeCalls(IRProgram* program, IRBuilder* builder) {
  std::list<std::pair<Instr*, NativeCallback*>> calls;

  for (IRHandler* handler : program->handlers()) {
    for (BasicBlock* bb : handler->basicBlocks()) {
      for (Instr* instr : bb->instructions()) {
        if (auto ci = dynamic_cast<CallInstr*>(instr)) {
          if (auto native = find(ci->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        } else if (auto hi = dynamic_cast<HandlerCallInstr*>(instr)) {
          if (auto native = find(hi->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        }
      }
    }
  }

  for (const std::pair<Instr*, NativeCallback*>& call : calls) {
    if (!call.second->verify(call.first, builder)) {
      return false;
    }
  }

  return true;
}